

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData256 *
cfd::core::CryptoUtil::MerkleHashSha256Midstate
          (ByteData256 *__return_storage_ptr__,ByteData256 *left,ByteData256 *right)

{
  CfdException *this;
  size_type bytes_len;
  uchar *bytes_out;
  size_type len;
  undefined8 uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe98;
  allocator_type *in_stack_fffffffffffffeb0;
  string *message;
  size_type in_stack_fffffffffffffeb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  CfdError error_code;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffec0;
  allocator local_e9;
  string local_e8 [32];
  CfdSourceLocation local_c8;
  int local_ac;
  iterator iStack_a8;
  int ret;
  uchar *local_a0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_98;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  const_iterator local_88;
  undefined1 local_80 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> right_buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  ByteData256 *right_local;
  ByteData256 *left_local;
  
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)right;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3f2418);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3f2438);
  ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &right_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,left);
  ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,
             (ByteData256 *)
             output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  local_90._M_current =
       (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          (in_stack_fffffffffffffe98);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_88,&local_90);
  local_98._M_current =
       (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          (in_stack_fffffffffffffe98);
  local_a0 = (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                (in_stack_fffffffffffffe98);
  iStack_a8 = ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
              insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                         &right_buffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,local_88,local_98,
                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )local_a0);
  message = (string *)
            &right_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  this = (CfdException *)
         ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3f24ec);
  bytes_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38;
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3f2516);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
  error_code = (CfdError)((ulong)this_00 >> 0x20);
  local_ac = wally_sha256_midstate((uchar *)this,bytes_len,bytes_out,len);
  if (local_ac != 0) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0x45b;
    local_c8.funcname = "MerkleHashSha256Midstate";
    logger::warn<int&>(&local_c8,"wally_sha256_midstate NG[{}].",&local_ac);
    uVar1 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_e8,"MerkleHash calc error.",&local_e9);
    CfdException::CfdException(this,error_code,message);
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData256::ByteData256
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 CryptoUtil::MerkleHashSha256Midstate(
    const ByteData256 &left, const ByteData256 &right) {
  // CSHA256().Write(left.begin(), 32).Write(right.begin(), 32)
  // .Midstate(output.begin(), NULL, NULL);
  std::vector<uint8_t> output(32);
  std::vector<uint8_t> buffer = left.GetBytes();
  std::vector<uint8_t> right_buffer = right.GetBytes();
  buffer.insert(buffer.end(), right_buffer.begin(), right_buffer.end());
  int ret = wally_sha256_midstate(
      buffer.data(), buffer.size(), output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_sha256_midstate NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "MerkleHash calc error.");
  }
  return ByteData256(output);
}